

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.hpp
# Opt level: O0

bool __thiscall antlr::BaseAST::equals(BaseAST *this,RefAST *t)

{
  int iVar1;
  int iVar2;
  AST *pAVar3;
  ASTRefCount *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  __type local_89;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  string local_60 [39];
  byte local_39;
  string local_38 [55];
  __type local_1;
  
  pAVar3 = ASTRefCount::operator_cast_to_AST_(in_RSI);
  if (pAVar3 == (AST *)0x0) {
    local_1 = false;
  }
  else {
    iVar1 = (**(code **)(*(long *)in_RDI + 0x80))();
    pAVar3 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RSI);
    iVar2 = (*pAVar3->_vptr_AST[0x10])();
    local_39 = 0;
    in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 & 0xffffff;
    local_89 = false;
    if (iVar1 == iVar2) {
      (**(code **)(*(long *)in_RDI + 0x78))(local_38);
      local_39 = 1;
      pAVar3 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RSI);
      (*pAVar3->_vptr_AST[0xf])(local_60);
      in_stack_ffffffffffffff90 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
      local_89 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                 in_RDI);
    }
    local_1 = local_89;
    if ((in_stack_ffffffffffffff90 & 0x1000000) != 0) {
      std::__cxx11::string::~string(local_60);
    }
    if ((local_39 & 1) != 0) {
      std::__cxx11::string::~string(local_38);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

inline bool BaseAST::equals(RefAST t) const
{
	if (!t)
		return false;
	return ((getType() == t->getType()) && (getText() == t->getText()));
}